

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O3

void addTemporary(char *name)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = strdup(tokenBuffer);
  if (pcVar2 == (char *)0x0) {
    error_impl("addTemporary",0x3bd,"addTemporary(): malloc failure!");
  }
  lVar3 = (long)tempTop;
  iVar1 = tempTop + 1;
  tempTop = iVar1;
  tempBuffer[lVar3] = pcVar2;
  if (0x1f2 < lVar3) {
    error_impl("addTemporary",0x3c3,"addTemporary(): too many temporaries!");
    iVar1 = tempTop;
  }
  if (maxTemp < iVar1) {
    maxTemp = iVar1;
  }
  return;
}

Assistant:

void addTemporary(char *name)
{
    char *p;

    p = strdup(name);
    if (!p) {
        error("addTemporary(): malloc failure!");
    }

    tempBuffer[tempTop++] = p;

    if(tempTop >= TempBufferTop) {
        error("addTemporary(): too many temporaries!");
    }

    if (tempTop > maxTemp) {
        maxTemp = tempTop;
    }
}